

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

uint64 __thiscall osc::ReceivedMessageArgument::AsTimeTag(ReceivedMessageArgument *this)

{
  MissingArgumentException *this_00;
  uint64 uVar1;
  WrongArgumentTypeException *this_01;
  ReceivedMessageArgument *this_local;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    this_00 = (MissingArgumentException *)__cxa_allocate_exception(0x10);
    MissingArgumentException::MissingArgumentException(this_00,"missing argument");
    __cxa_throw(this_00,&MissingArgumentException::typeinfo,
                MissingArgumentException::~MissingArgumentException);
  }
  if (*this->typeTagPtr_ == 't') {
    uVar1 = AsTimeTagUnchecked(this);
    return uVar1;
  }
  this_01 = (WrongArgumentTypeException *)__cxa_allocate_exception(0x10);
  WrongArgumentTypeException::WrongArgumentTypeException(this_01,"wrong argument type");
  __cxa_throw(this_01,&WrongArgumentTypeException::typeinfo,
              WrongArgumentTypeException::~WrongArgumentTypeException);
}

Assistant:

uint64 ReceivedMessageArgument::AsTimeTag() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == TIME_TAG_TYPE_TAG )
		return AsTimeTagUnchecked();
	else
		throw WrongArgumentTypeException();
}